

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O3

DataType __thiscall
csv::internals::data_type(internals *this,string_view in,longdouble *out,char decimalSymbol)

{
  internals iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  DataType DVar5;
  DataType DVar6;
  longdouble *out_00;
  internals *piVar7;
  internals *piVar8;
  longdouble *extraout_RDX;
  undefined8 unaff_RBX;
  undefined8 uVar9;
  uint uVar10;
  size_t sVar11;
  char *pcVar12;
  char *this_00;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  longdouble lVar16;
  longdouble lVar17;
  longdouble lVar18;
  longdouble lVar19;
  string_view in_00;
  string_view exponential_part;
  longdouble lStack_80;
  undefined8 uStack_68;
  code *pcStack_60;
  uint local_4c;
  longdouble local_48;
  
  out_00 = (longdouble *)in._M_str;
  sVar11 = in._M_len;
  if (this != (internals *)0x0) {
    lVar18 = (longdouble)0;
    bVar2 = true;
    uVar9 = CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
    bVar15 = true;
    bVar4 = false;
    piVar7 = (internals *)0x0;
    uVar14 = 0;
    bVar3 = false;
    uVar10 = 0;
    lVar19 = lVar18;
    do {
      iVar1 = piVar7[sVar11];
      if ((byte)iVar1 < 0x2d) {
        if (iVar1 == (internals)0x20) {
          if (!bVar2) {
            if (9 < (int)(char)piVar7[sVar11 - 1] - 0x30U) {
              return CSV_STRING;
            }
            bVar2 = true;
            bVar15 = false;
          }
        }
        else {
          if (iVar1 == (internals)0x2b) goto LAB_0010c6fd;
LAB_0010c749:
          if ((byte)((char)iVar1 - 0x30U) < 10) {
            if (!bVar15) {
              return CSV_STRING;
            }
            local_4c = (int)(char)iVar1 - 0x30;
            uVar14 = (ulong)local_4c;
            if (bVar2) {
              bVar2 = false;
            }
            if (bVar3) {
              uVar10 = uVar10 + 1;
              lVar16 = (longdouble)1;
              if (uVar10 != 0) {
                uVar14 = (ulong)uVar10;
                do {
                  lVar16 = lVar16 * (longdouble)10.0;
                  uVar13 = (int)uVar14 - 1;
                  uVar14 = (ulong)uVar13;
                } while (uVar13 != 0);
              }
              lVar19 = (longdouble)(int)local_4c / lVar16 + lVar19;
            }
            else {
              lVar18 = lVar18 * (longdouble)10.0 + (longdouble)(int)local_4c;
            }
            uVar14 = CONCAT71((int7)(uVar14 >> 8),1);
            bVar15 = true;
          }
          else {
            if ((~(byte)uVar9 & 1) != 0 || iVar1 != SUB81(out,0)) {
              return CSV_STRING;
            }
            bVar3 = true;
            uVar9 = 0;
          }
        }
      }
      else {
        if (iVar1 != (internals)0x2d) {
          if ((iVar1 == (internals)0x45) || (iVar1 == (internals)0x65)) {
            if (!bVar3) {
              if (this <= piVar7 + 1 || piVar7 == (internals *)0x0) {
                return CSV_STRING;
              }
              if (9 < (int)(char)piVar7[sVar11 - 1] - 0x30U) {
                return CSV_STRING;
              }
            }
            piVar8 = piVar7 + 2;
            if ((piVar7 + 1)[sVar11] != (internals)0x2b) {
              piVar8 = piVar7 + 1;
            }
            exponential_part._M_len = (long)this - (long)piVar8;
            if (this < piVar8) {
              this_00 = "%s: __pos (which is %zu) > __size (which is %zu)";
              pcVar12 = "basic_string_view::substr";
              pcStack_60 = _process_potential_exponential;
              std::__throw_out_of_range_fmt("%s: __pos (which is %zu) > __size (which is %zu)");
              lStack_80 = (longdouble)0;
              in_00._M_str = (char *)&lStack_80;
              in_00._M_len = (size_t)pcVar12;
              uStack_68 = uVar9;
              pcStack_60 = (code *)uVar14;
              DVar5 = data_type((internals *)this_00,in_00,(longdouble *)0x2e,(char)out_00);
              DVar6 = CSV_STRING;
              if (((uint)(DVar5 + ~CSV_STRING) < 5) &&
                 (DVar6 = CSV_DOUBLE, this != (internals *)0x0)) {
                lVar19 = -lStack_80;
                lVar18 = lVar19;
                if (lVar19 <= lStack_80 || lStack_80 != lVar19) {
                  lVar18 = lStack_80;
                }
                lVar16 = (longdouble)1;
                lVar17 = (longdouble)0;
                if (lVar17 < lVar18) {
                  lVar16 = (longdouble)1;
                  do {
                    lVar16 = lVar16 * *(longdouble *)
                                       (&DAT_0010d6f0 + (ulong)(lVar19 < lStack_80) * 0x10);
                    lVar17 = lVar17 + (longdouble)1;
                  } while (lVar17 < lVar18);
                }
                *(longdouble *)this = lVar16 * *extraout_RDX;
              }
              return DVar6;
            }
            exponential_part._M_str = piVar8 + sVar11;
            local_48 = lVar18 + lVar19;
            if (bVar4) {
              local_48 = -(lVar18 + lVar19);
            }
            pcStack_60 = (code *)0x10c869;
            DVar5 = _process_potential_exponential(exponential_part,&local_48,out_00);
            return DVar5;
          }
          goto LAB_0010c749;
        }
        bVar4 = true;
LAB_0010c6fd:
        if (!bVar2) {
          return CSV_STRING;
        }
      }
      piVar7 = piVar7 + 1;
    } while (piVar7 != this);
    if ((uVar14 & 1) != 0) {
      local_48 = lVar18 + lVar19;
      if (out_00 != (longdouble *)0x0) {
        lVar18 = local_48;
        if (bVar4) {
          lVar18 = -local_48;
        }
        *out_00 = lVar18;
      }
      if (!bVar3) {
        pcStack_60 = (code *)0x10c816;
        DVar5 = _determine_integral_type(&local_48);
        return DVar5;
      }
      return CSV_DOUBLE;
    }
  }
  return CSV_NULL;
}

Assistant:

CONSTEXPR_14
        DataType data_type(csv::string_view in, long double* const out, const char decimalSymbol) {
            // Empty string --> NULL
            if (in.size() == 0)
                return DataType::CSV_NULL;

            bool ws_allowed = true,
                dot_allowed = true,
                digit_allowed = true,
                is_negative = false,
                has_digit = false,
                prob_float = false;

            unsigned places_after_decimal = 0;
            long double integral_part = 0,
                decimal_part = 0;

            for (size_t i = 0, ilen = in.size(); i < ilen; i++) {
                const char& current = in[i];

                switch (current) {
                case ' ':
                    if (!ws_allowed) {
                        if (isdigit(in[i - 1])) {
                            digit_allowed = false;
                            ws_allowed = true;
                        }
                        else {
                            // Ex: '510 123 4567'
                            return DataType::CSV_STRING;
                        }
                    }
                    break;
                case '+':
                    if (!ws_allowed) {
                        return DataType::CSV_STRING;
                    }

                    break;
                case '-':
                    if (!ws_allowed) {
                        // Ex: '510-123-4567'
                        return DataType::CSV_STRING;
                    }

                    is_negative = true;
                    break;
                // case decimalSymbol: not allowed because decimalSymbol is not a literal,
                // it is handled in the default block
                case 'e':
                case 'E':
                    // Process scientific notation
                    if (prob_float || (i && i + 1 < ilen && isdigit(in[i - 1]))) {
                        size_t exponent_start_idx = i + 1;
                        prob_float = true;

                        // Strip out plus sign
                        if (in[i + 1] == '+') {
                            exponent_start_idx++;
                        }

                        return _process_potential_exponential(
                            in.substr(exponent_start_idx),
                            is_negative ? -(integral_part + decimal_part) : integral_part + decimal_part,
                            out
                        );
                    }

                    return DataType::CSV_STRING;
                    break;
                default:
                    short digit = static_cast<short>(current - '0');
                    if (digit >= 0 && digit <= 9) {
                        // Process digit
                        has_digit = true;

                        if (!digit_allowed)
                            return DataType::CSV_STRING;
                        else if (ws_allowed) // Ex: '510 456'
                            ws_allowed = false;

                        // Build current number
                        if (prob_float)
                            decimal_part += digit / pow10(++places_after_decimal);
                        else
                            integral_part = (integral_part * 10) + digit;
                    }
                    // case decimalSymbol: not allowed because decimalSymbol is not a literal. 
                    else if (dot_allowed && current == decimalSymbol) {
                        dot_allowed = false;
                        prob_float = true;
                    }
                    else {
                        return DataType::CSV_STRING;
                    }
                }
            }

            // No non-numeric/non-whitespace characters found
            if (has_digit) {
                long double number = integral_part + decimal_part;
                if (out) {
                    *out = is_negative ? -number : number;
                }

                return prob_float ? DataType::CSV_DOUBLE : _determine_integral_type(number);
            }

            // Just whitespace
            return DataType::CSV_NULL;
        }